

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

void __thiscall argparse::ArgumentParser::index_argument(ArgumentParser *this,list_iterator argIt)

{
  _List_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mName;
  _List_node_base *p_Var2;
  _List_iterator<argparse::Argument> local_40;
  key_type local_38;
  
  p_Var2 = argIt._M_node[1]._M_next;
  p_Var1 = argIt._M_node[1]._M_prev;
  if (p_Var2 != p_Var1) {
    local_40._M_node = argIt._M_node;
    do {
      local_38._M_str = (char *)p_Var2->_M_next;
      local_38._M_len = (size_t)p_Var2->_M_prev;
      std::
      map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
      ::insert_or_assign<std::_List_iterator<argparse::Argument>&>
                ((map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                  *)&this->mArgumentMap,&local_38,&local_40);
      p_Var2 = p_Var2 + 2;
    } while (p_Var2 != p_Var1);
  }
  return;
}

Assistant:

void index_argument(list_iterator argIt) {
    for (auto &mName : std::as_const(argIt->mNames))
      mArgumentMap.insert_or_assign(mName, argIt);
  }